

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor_injection.cpp
# Opt level: O2

int main(void)

{
  ctor_inject local_b;
  ctor_inject_traits local_a;
  ctor_di_traits local_9;
  
  ctor_inject::ctor_inject(&local_b,0,0x2a);
  ctor_inject_traits::ctor_inject_traits(&local_a,0,0x2a);
  ctor_di_traits::ctor_di_traits(&local_9,0,0x2a);
  return 0;
}

Assistant:

int main() {
  /*<<make injector>>*/
  // clang-format off
  auto injector = di::make_injector(
    di::bind<int>().named(name).to(42)
  );
  // clang-format on

  /*<<create dependencies>>*/
  injector.create<ctor_inject>();
  injector.create<ctor_inject_traits>();
  injector.create<ctor_di_traits>();

  injector.create<ctor_inject_traits_no_limits>();
}